

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O1

void Gs::Normalize<Gs::Vector<float,3ul>,float>
               (Vector<float,_3UL> *outVec,Vector<float,_3UL> *inVec)

{
  float fVar1;
  float fVar2;
  size_t i;
  long lVar3;
  float result;
  float fVar4;
  
  fVar4 = 0.0;
  lVar3 = 0;
  do {
    fVar4 = fVar4 + (&inVec->x)[lVar3] * (&inVec->x)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (((fVar4 == 0.0) && (!NAN(fVar4))) || ((fVar4 == 1.0 && (!NAN(fVar4))))) {
    outVec->z = inVec->z;
    fVar4 = inVec->y;
    outVec->x = inVec->x;
    outVec->y = fVar4;
  }
  else {
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = 1.0 / fVar4;
    fVar1 = inVec->y;
    fVar2 = inVec->z;
    outVec->x = inVec->x * fVar4;
    outVec->y = fVar1 * fVar4;
    outVec->z = fVar4 * fVar2;
  }
  return;
}

Assistant:

void Normalize(TVector& outVec, const TVector& inVec)
{
    TScalar len = LengthSq<TVector, TScalar>(inVec);
    if (len != TScalar(0) && len != TScalar(1))
    {
        len = TScalar(1) / std::sqrt(len);
        outVec = inVec * len;
    }
    else
        outVec = inVec;
}